

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O2

void nk_plot_function(nk_context *ctx,nk_chart_type type,void *userdata,
                     _func_float_void_ptr_int *value_getter,int count,int offset)

{
  int iVar1;
  int iVar2;
  int iVar3;
  bool bVar4;
  float fVar5;
  float fVar6;
  float max_value;
  
  if (ctx == (nk_context *)0x0) {
    __assert_fail("ctx",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/Tigermouthbear[P]flappytiger/external/glfw/deps/nuklear.h"
                  ,0x5e1d,
                  "void nk_plot_function(struct nk_context *, enum nk_chart_type, void *, float (*)(void *, int), int, int)"
                 );
  }
  if (value_getter == (_func_float_void_ptr_int *)0x0) {
    __assert_fail("value_getter",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/Tigermouthbear[P]flappytiger/external/glfw/deps/nuklear.h"
                  ,0x5e1e,
                  "void nk_plot_function(struct nk_context *, enum nk_chart_type, void *, float (*)(void *, int), int, int)"
                 );
  }
  if (count != 0) {
    fVar5 = (*value_getter)(userdata,offset);
    max_value = fVar5;
    iVar2 = offset;
    iVar1 = 0;
    iVar3 = 0;
    if (0 < count) {
      iVar1 = count;
      iVar3 = count;
    }
    while (iVar1 != 0) {
      fVar6 = (*value_getter)(userdata,iVar2);
      if (max_value <= fVar6) {
        max_value = fVar6;
      }
      if (fVar5 <= fVar6) {
        fVar6 = fVar5;
      }
      fVar5 = fVar6;
      iVar2 = iVar2 + 1;
      iVar1 = iVar1 + -1;
    }
    iVar1 = nk_chart_begin(ctx,type,count,fVar5,max_value);
    if (iVar1 != 0) {
      while (bVar4 = iVar3 != 0, iVar3 = iVar3 + -1, bVar4) {
        fVar5 = (*value_getter)(userdata,offset);
        nk_chart_push(ctx,fVar5);
        offset = offset + 1;
      }
      nk_chart_end(ctx);
      return;
    }
  }
  return;
}

Assistant:

NK_API void
nk_plot_function(struct nk_context *ctx, enum nk_chart_type type, void *userdata,
    float(*value_getter)(void* user, int index), int count, int offset)
{
    int i = 0;
    float min_value;
    float max_value;

    NK_ASSERT(ctx);
    NK_ASSERT(value_getter);
    if (!ctx || !value_getter || !count) return;

    max_value = min_value = value_getter(userdata, offset);
    for (i = 0; i < count; ++i) {
        float value = value_getter(userdata, i + offset);
        min_value = NK_MIN(value, min_value);
        max_value = NK_MAX(value, max_value);
    }

    if (nk_chart_begin(ctx, type, count, min_value, max_value)) {
        for (i = 0; i < count; ++i)
            nk_chart_push(ctx, value_getter(userdata, i + offset));
        nk_chart_end(ctx);
    }
}